

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O1

int Dar_NewChoiceSynthesisGuard(Aig_Man_t *pAig)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  lVar3 = (long)pAig->vObjs->nSize;
  if (0 < lVar3) {
    lVar4 = 0;
    iVar5 = 0;
    do {
      pvVar2 = pAig->vObjs->pArray[lVar4];
      if (((pvVar2 != (void *)0x0) && (uVar1 = *(uint *)((long)pvVar2 + 0x18), 0xfa3f < uVar1)) &&
         ((uVar1 & 7) - 5 < 2)) {
        iVar5 = uVar1 / 64000 + iVar5;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
    return (int)(10 < iVar5);
  }
  return 0;
}

Assistant:

int Dar_NewChoiceSynthesisGuard( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj;
    int i, Count = 0;
    Aig_ManForEachNode( pAig, pObj, i )
        if ( Aig_ObjRefs(pObj) > 1000 )
            Count += Aig_ObjRefs(pObj) / 1000;
    return (int)(Count > 10);
}